

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void changes(sqlite3_context *context,int NotUsed,sqlite3_value **NotUsed2)

{
  sqlite3_result_int(context,((context->s).db)->nChange);
  return;
}

Assistant:

static void changes(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **NotUsed2
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  UNUSED_PARAMETER2(NotUsed, NotUsed2);
  sqlite3_result_int(context, sqlite3_changes(db));
}